

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astring.c
# Opt level: O3

AString * AString_constructWithCapacityAndAllocator
                    (size_t capacity,ACUtilsReallocator reallocator,ACUtilsDeallocator deallocator)

{
  AString *pAVar1;
  char *pcVar2;
  size_t sVar3;
  AString *pAVar4;
  
  if (deallocator == (ACUtilsDeallocator)0x0 || reallocator == (ACUtilsReallocator)0x0) {
    pAVar4 = (AString *)0x0;
  }
  else {
    pAVar1 = (AString *)(*reallocator)((void *)0x0,0x28);
    pAVar4 = (AString *)0x0;
    if (pAVar1 != (AString *)0x0) {
      sVar3 = 8;
      if (8 < capacity) {
        sVar3 = capacity;
      }
      pAVar1->reallocator = reallocator;
      pAVar1->deallocator = deallocator;
      pAVar1->size = 0;
      pAVar1->capacity = 0;
      pAVar1->buffer = (char *)0x0;
      pAVar1->capacity = sVar3;
      pcVar2 = (char *)(*reallocator)((void *)0x0,sVar3 + 1);
      pAVar1->buffer = pcVar2;
      if (pcVar2 == (char *)0x0) {
        pAVar4 = (AString *)0x0;
        (*pAVar1->deallocator)((void *)0x0);
        (*pAVar1->deallocator)(pAVar1);
      }
      else {
        *pcVar2 = '\0';
        pAVar4 = pAVar1;
      }
    }
  }
  return pAVar4;
}

Assistant:

AString* AString_constructWithCapacityAndAllocator(size_t capacity, ACUtilsReallocator reallocator, ACUtilsDeallocator deallocator)
{
    struct AString *string;
    if(reallocator == nullptr || deallocator == nullptr)
        return nullptr;
    if(capacity < private_ACUtils_AString_capacityMin)
        capacity = private_ACUtils_AString_capacityMin;
    string = (struct AString*) reallocator(nullptr, sizeof(struct AString));
    if(string != nullptr) {
        struct AString tmpString = { reallocator, deallocator};
        memcpy(string, &tmpString, sizeof(struct AString));
        string->size = 0;
        string->capacity = capacity;
        string->buffer = (char*) string->reallocator(nullptr, (string->capacity + 1) * sizeof(char));
        if(string->buffer == nullptr) {
            AString_destruct(string);
            return nullptr;
        }
        string->buffer[0] = '\0';
    }
    return string;
}